

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O1

void __thiscall
TasGrid::TasmanianSparseGrid::getDifferentiationWeights
          (TasmanianSparseGrid *this,double *x,double *weights)

{
  BaseCanonicalGrid *pBVar1;
  MultiIndexSet *pMVar2;
  double *pdVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  vector<double,_std::allocator<double>_> jacobian_g_diag;
  Data2D<double> x_tmp;
  vector<double,_std::allocator<double>_> local_60;
  Data2D<double> local_48;
  
  local_48.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.stride = 0;
  local_48.num_strips = 0;
  local_48.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pBVar1 = (this->base)._M_t.
           super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
  pdVar3 = formCanonicalPoints<double>(this,x,&local_48,1);
  (*pBVar1->_vptr_BaseCanonicalGrid[0xe])(pBVar1,pdVar3,weights);
  if ((this->domain_transform_a).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->domain_transform_a).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pBVar1 = (this->base)._M_t.
             super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl;
    uVar7 = 0;
    uVar4 = 0;
    if (pBVar1 != (BaseCanonicalGrid *)0x0) {
      uVar4 = pBVar1->num_dimensions;
      pMVar2 = &pBVar1->points;
      if (*(pointer *)
           &(pBVar1->points).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl ==
          (pBVar1->points).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pMVar2 = &pBVar1->needed;
      }
      uVar7 = *(int *)((long)pMVar2 + 8);
    }
    diffCanonicalTransform<double>(&local_60,this);
    if (0 < (int)uVar7) {
      uVar5 = 0;
      do {
        if (0 < (int)uVar4) {
          uVar6 = 0;
          do {
            weights[uVar6] =
                 weights[uVar6] *
                 local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar4 != uVar6);
        }
        uVar5 = uVar5 + 1;
        weights = weights + uVar4;
      } while (uVar5 != uVar7);
    }
    if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (local_48.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TasmanianSparseGrid::getDifferentiationWeights(const double x[], double weights[]) const{
    // See differentiate() for how the domain transforms are taken into consideration.
    Data2D<double> x_tmp;
    // Jacobian of f(.) at g(x).
    base->getDifferentiationWeights(formCanonicalPoints(x, x_tmp, 1), weights);
    // Jacobian of f(g(.)) at x.
    if (not domain_transform_a.empty()) {
        int num_dimensions = getNumDimensions();
        int num_points = getNumPoints();
        std::vector<double> jacobian_g_diag = diffCanonicalTransform<double>();
        for(int i=0; i<num_points; i++)
            for(int j=0; j<num_dimensions; j++)
                weights[i * num_dimensions + j] = weights[i * num_dimensions + j] * jacobian_g_diag[j];
    }
}